

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

Machine * unifyVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  Hcell local_50;
  Machine *local_20;
  Machine *m_local;
  Machine *pMStack_10;
  Register r_local;
  
  local_20 = m;
  m_local._4_4_ = r.r;
  pMStack_10 = __return_storage_ptr__;
  if (m->mode == Read) {
    pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->s);
    pmVar2 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,(key_type *)((long)&m_local + 4));
    Hcell::operator=(pmVar2,pmVar1);
  }
  else if (m->mode == Write) {
    Hcell::ref(&local_50,(Hix)(m->h).hix);
    pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->h);
    Hcell::operator=(pmVar1,&local_50);
    Hcell::~Hcell(&local_50);
    pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&m->h);
    pmVar2 = std::
             map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
             ::operator[](&m->regval,(key_type *)((long)&m_local + 4));
    Hcell::operator=(pmVar2,pmVar1);
    Hix::operator+=(&m->h,1);
  }
  Hix::operator+=(&m->s,1);
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine unifyVariable(Machine m, Register r) {
    switch (m.mode) {
        case Mode::Read:
            m.regval[r] = m.heap[m.s];
            break;
        case Mode::Write:
            m.heap[m.h] = Hcell::ref(m.h);
            m.regval[r] = m.heap[m.h];
            m.h += 1;
            break;
    }
    m.s += 1;
    return m;
}